

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

void __thiscall
Lib::
Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
::expand(Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
         *this)

{
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *pFVar1;
  size_t sVar2;
  size_t i;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  
  sVar5 = 8;
  if (this->_capacity != 0) {
    sVar5 = this->_capacity * 2;
  }
  pFVar1 = (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
           Lib::alloc(sVar5 * 0x40);
  uVar4 = this->_capacity;
  if (uVar4 == 0) {
    sVar2 = 0;
  }
  else {
    lVar6 = 0;
    for (uVar3 = 0; uVar3 < uVar4; uVar3 = uVar3 + 1) {
      Inferences::ALASCA::VariableElimination::
      FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>::FoundVarInLiteral
                ((FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                 ((long)(pFVar1->numeral)._num._val + lVar6 + -8),
                 (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                 ((long)(this->_stack->numeral)._num._val + lVar6 + -8));
      Kernel::RationalConstantType::~RationalConstantType
                ((RationalConstantType *)
                 ((long)&(this->_stack->numeral)._num._val[0]._mp_alloc + lVar6));
      uVar4 = this->_capacity;
      lVar6 = lVar6 + 0x40;
    }
    Lib::free(this->_stack);
    sVar2 = this->_capacity;
  }
  this->_stack = pFVar1;
  this->_cursor = pFVar1 + sVar2;
  this->_end = pFVar1 + sVar5;
  this->_capacity = sVar5;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }